

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

bool __thiscall
miniros::MasterLink::getParamImpl<double>
          (MasterLink *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *map,bool cached)

{
  bool bVar1;
  mapped_type_conflict *pmVar2;
  _Rb_tree_node_base *p_Var3;
  RpcValue xml_value;
  RpcValue local_50;
  mapped_type_conflict local_40;
  XmlRpcValue local_38;
  
  local_50._type = TypeInvalid;
  local_50._value.asDouble = 0.0;
  bVar1 = getParamImpl(this,key,&local_50,cached);
  if (bVar1 && local_50._type == TypeStruct) {
    XmlRpc::XmlRpcValue::assertStruct(&local_50);
    p_Var3 = *(_Rb_tree_node_base **)&(local_50._value.asTime)->tm_wday;
    while( true ) {
      XmlRpc::XmlRpcValue::assertStruct(&local_50);
      bVar1 = p_Var3 == (_Rb_tree_node_base *)&(local_50._value.asTime)->tm_hour;
      if ((bVar1) || (2 < p_Var3[2]._M_color - _S_black)) break;
      local_38._type = TypeInvalid;
      XmlRpc::XmlRpcValue::operator=(&local_38,(XmlRpcValue *)(p_Var3 + 2));
      local_40 = xml_cast<double>(&local_38);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](map,(key_type *)(p_Var3 + 1));
      *pmVar2 = local_40;
      XmlRpc::XmlRpcValue::invalidate(&local_38);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    }
  }
  else {
    bVar1 = false;
  }
  XmlRpc::XmlRpcValue::invalidate(&local_50);
  return bVar1;
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::map<std::string, T>& map, bool cached)
{
  RpcValue xml_value;
  if (!getParamImpl(key, xml_value, cached)) {
    return false;
  }

  // Make sure it's a struct type
  if (xml_value.getType() != RpcValue::TypeStruct) {
    return false;
  }

  // Fill the map with stuff
  for (auto it = xml_value.begin(); it != xml_value.end(); ++it) {
    // Make sure this element is the right type
    if (!xml_castable<T>(it->second.getType())) {
      return false;
    }
    // Store the element
    map[it->first] = xml_cast<T>(it->second);
  }

  return true;
}